

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmFor(LlvmCompilationContext *ctx,ExprFor *node)

{
  ExprBase *pEVar1;
  int iVar2;
  ExprFor *ctx_00;
  SmallArray<LlvmCompilationContext::LoopInfo,_32U> *this;
  LLVMValueRef pLVar3;
  TypeBase *type;
  LLVMTypeRef pLVar4;
  LLVMValueRef pLVar5;
  LLVMValueRef condition;
  LLVMBasicBlockRef local_38;
  LLVMBasicBlockRef exitBlock;
  LLVMBasicBlockRef iterationBlock;
  LLVMBasicBlockRef bodyBlock;
  LLVMBasicBlockRef conditionBlock;
  ExprFor *node_local;
  LlvmCompilationContext *ctx_local;
  
  conditionBlock = (LLVMBasicBlockRef)node;
  node_local = (ExprFor *)ctx;
  CompileLlvm(ctx,node->initializer);
  bodyBlock = LLVMAppendBasicBlockInContext
                        ((LLVMContextRef)(node_local->super_ExprBase).source,
                         (LLVMValueRef)node_local[0x34].increment,"for_cond");
  iterationBlock =
       LLVMAppendBasicBlockInContext
                 ((LLVMContextRef)(node_local->super_ExprBase).source,
                  (LLVMValueRef)node_local[0x34].increment,"for_body");
  exitBlock = LLVMAppendBasicBlockInContext
                        ((LLVMContextRef)(node_local->super_ExprBase).source,
                         (LLVMValueRef)node_local[0x34].increment,"for_iter");
  local_38 = LLVMAppendBasicBlockInContext
                       ((LLVMContextRef)(node_local->super_ExprBase).source,
                        (LLVMValueRef)node_local[0x34].increment,"for_exit");
  this = (SmallArray<LlvmCompilationContext::LoopInfo,_32U> *)(node_local + 0x37);
  LlvmCompilationContext::LoopInfo::LoopInfo((LoopInfo *)&condition,local_38,exitBlock);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::push_back(this,(LoopInfo *)&condition);
  LLVMBuildBr((LLVMBuilderRef)(node_local->super_ExprBase).next,bodyBlock);
  LLVMPositionBuilderAtEnd((LLVMBuilderRef)(node_local->super_ExprBase).next,bodyBlock);
  pLVar3 = CompileLlvm((LlvmCompilationContext *)node_local,*(ExprBase **)(conditionBlock + 0x38));
  ctx_00 = node_local;
  iVar2 = LLVMIntNE;
  pEVar1 = (node_local->super_ExprBase).next;
  type = GetStackType((LlvmCompilationContext *)node_local,
                      *(TypeBase **)(*(long *)(conditionBlock + 0x38) + 0x18));
  pLVar4 = CompileLlvmType((LlvmCompilationContext *)ctx_00,type);
  pLVar5 = LLVMConstInt(pLVar4,0,true);
  pLVar3 = LLVMBuildICmp((LLVMBuilderRef)pEVar1,iVar2,pLVar3,pLVar5,"");
  LLVMBuildCondBr((LLVMBuilderRef)(node_local->super_ExprBase).next,pLVar3,iterationBlock,local_38);
  LLVMPositionBuilderAtEnd((LLVMBuilderRef)(node_local->super_ExprBase).next,iterationBlock);
  CompileLlvm((LlvmCompilationContext *)node_local,*(ExprBase **)(conditionBlock + 0x48));
  LLVMBuildBr((LLVMBuilderRef)(node_local->super_ExprBase).next,exitBlock);
  LLVMPositionBuilderAtEnd((LLVMBuilderRef)(node_local->super_ExprBase).next,exitBlock);
  CompileLlvm((LlvmCompilationContext *)node_local,*(ExprBase **)(conditionBlock + 0x40));
  LLVMBuildBr((LLVMBuilderRef)(node_local->super_ExprBase).next,bodyBlock);
  LLVMPositionBuilderAtEnd((LLVMBuilderRef)(node_local->super_ExprBase).next,local_38);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::pop_back
            ((SmallArray<LlvmCompilationContext::LoopInfo,_32U> *)(node_local + 0x37));
  pLVar3 = CheckType((LlvmCompilationContext *)node_local,(ExprBase *)conditionBlock,
                     (LLVMValueRef)0x0);
  return pLVar3;
}

Assistant:

LLVMValueRef CompileLlvmFor(LlvmCompilationContext &ctx, ExprFor *node)
{
	CompileLlvm(ctx, node->initializer);

	LLVMBasicBlockRef conditionBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "for_cond");
	LLVMBasicBlockRef bodyBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "for_body");
	LLVMBasicBlockRef iterationBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "for_iter");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "for_exit");

	ctx.loopInfo.push_back(LlvmCompilationContext::LoopInfo(exitBlock, iterationBlock));

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, conditionBlock);

	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBuildCondBr(ctx.builder, condition, bodyBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, bodyBlock);

	CompileLlvm(ctx, node->body);

	LLVMBuildBr(ctx.builder, iterationBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, iterationBlock);

	CompileLlvm(ctx, node->increment);

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	ctx.loopInfo.pop_back();

	return CheckType(ctx, node, NULL);
}